

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

void uv__udp_mmsg_init(void)

{
  int fd;
  int iVar1;
  int *piVar2;
  
  fd = uv__socket(2,2,0);
  if (fd < 0) {
    return;
  }
  iVar1 = uv__sendmmsg(fd,(uv__mmsghdr *)0x0,0);
  if ((iVar1 == 0) || (piVar2 = __errno_location(), *piVar2 != 0x26)) {
    uv__sendmmsg_avail = 1;
  }
  else {
    iVar1 = uv__recvmmsg(fd,(uv__mmsghdr *)0x0,0);
    if ((iVar1 != 0) && (*piVar2 == 0x26)) goto LAB_006b9189;
  }
  uv__recvmmsg_avail = 1;
LAB_006b9189:
  uv__close(fd);
  return;
}

Assistant:

static void uv__udp_mmsg_init(void) {
  int ret;
  int s;
  s = uv__socket(AF_INET, SOCK_DGRAM, 0);
  if (s < 0)
    return;
  ret = uv__sendmmsg(s, NULL, 0);
  if (ret == 0 || errno != ENOSYS) {
    uv__sendmmsg_avail = 1;
    uv__recvmmsg_avail = 1;
  } else {
    ret = uv__recvmmsg(s, NULL, 0);
    if (ret == 0 || errno != ENOSYS)
      uv__recvmmsg_avail = 1;
  }
  uv__close(s);
}